

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

int os_banner_getinfo(void *banner_handle,os_banner_info_t *info)

{
  ulong uVar1;
  uint uVar2;
  
  info->align = *(int *)((long)banner_handle + 0x20);
  info->style = 0;
  uVar1 = (ulong)((*(uint *)((long)banner_handle + 4) & 1) << 3);
  info->style = uVar1;
  uVar2 = *(uint *)((long)banner_handle + 4);
  if ((uVar2 & 8) != 0) {
    uVar1 = uVar1 | 0x40;
    info->style = uVar1;
    uVar2 = *(uint *)((long)banner_handle + 4);
  }
  if ((uVar2 & 0x20) != 0) {
    uVar1 = uVar1 | 0x80;
    info->style = uVar1;
    uVar2 = *(uint *)((long)banner_handle + 4);
  }
  if ((uVar2 & 0x10) != 0) {
    uVar1 = uVar1 | 0x100;
    info->style = uVar1;
  }
  info->rows = *(int *)((long)banner_handle + 0x40);
  info->columns = *(int *)((long)banner_handle + 0x38);
  info->pix_width = 0;
  info->pix_height = 0;
  info->style = uVar1 | 0x20;
  info->os_line_wrap = 0;
  return 1;
}

Assistant:

int os_banner_getinfo(void *banner_handle, os_banner_info_t *info)
{
    osgen_win_t *win = (osgen_win_t *)banner_handle;

    /* set the alignment */
    info->align = win->alignment;

    /* set the flags */
    info->style = 0;
    if ((win->flags & OSGEN_AUTO_VSCROLL) != 0)
        info->style |= OS_BANNER_STYLE_AUTO_VSCROLL;
    if ((win->flags & OSGEN_MOREMODE) != 0)
        info->style |= OS_BANNER_STYLE_MOREMODE;
    if ((win->flags & OSGEN_HSTRUT) != 0)
        info->style |= OS_BANNER_STYLE_HSTRUT;
    if ((win->flags & OSGEN_VSTRUT) != 0)
        info->style |= OS_BANNER_STYLE_VSTRUT;

    /* set the character size */
    info->rows = win->ht;
    info->columns = win->wid;

    /* we're a character-mode platform, so we don't have a pixel size */
    info->pix_width = 0;
    info->pix_height = 0;

    /* 
     *   We are designed for fixed-pitch character-mode displays only, so we
     *   support <TAB> alignment by virtue of our fixed pitch.
     */
    info->style |= OS_BANNER_STYLE_TAB_ALIGN;

    /* we do not do our own line wrapping */
    info->os_line_wrap = FALSE;

    /* indicate success */
    return TRUE;
}